

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O1

void do_oracles(char *infile,char *outfile)

{
  bool bVar1;
  bool bVar2;
  FILE *pFVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  byte *pbVar7;
  char *pcVar8;
  long lVar9;
  byte *pbVar10;
  byte bVar11;
  uint uVar12;
  byte bVar13;
  char (*__s2) [3];
  char tempfile [256];
  long offset;
  char local_238 [256];
  long local_138 [33];
  
  sprintf(local_238,"%s.%s",outfile,"tmp");
  ifp = (FILE *)fopen(infile,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
LAB_0010b5e1:
    do_oracles_cold_4();
  }
  else {
    ofp = (FILE *)fopen(outfile,"w+");
    if ((FILE *)ofp != (FILE *)0x0) {
      tfp = (FILE *)fopen(local_238,"w+");
      if ((FILE *)tfp != (FILE *)0x0) {
        fprintf((FILE *)ofp,"%s%5d\n",
                "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",0);
        fputs("---\n",(FILE *)tfp);
        pFVar3 = ofp;
        lVar6 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar3,"%05lx\n",lVar6);
        lVar6 = 0;
        do {
          pbVar7 = (byte *)special_oracle[lVar6];
          bVar11 = *pbVar7;
          pbVar10 = &xcrypt_buf;
          if (bVar11 != 0) {
            iVar4 = 1;
            pbVar10 = &xcrypt_buf;
            do {
              pbVar7 = pbVar7 + 1;
              bVar13 = (byte)iVar4;
              if ((bVar11 & 0x60) == 0) {
                bVar13 = 0;
              }
              *pbVar10 = bVar13 ^ bVar11;
              iVar4 = iVar4 * 2;
              if (0x1f < iVar4) {
                iVar4 = 1;
              }
              pbVar10 = pbVar10 + 1;
              bVar11 = *pbVar7;
            } while (bVar11 != 0);
          }
          *pbVar10 = 0;
          fputs(&xcrypt_buf,(FILE *)tfp);
          fputc(10,(FILE *)tfp);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 10);
        fputs("---\n",(FILE *)tfp);
        pFVar3 = ofp;
        lVar6 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar3,"%05lx\n",lVar6);
        uVar12 = 1;
LAB_0010b29a:
        bVar2 = true;
LAB_0010b29d:
        while (pcVar8 = fgets(in_line,0x100,(FILE *)ifp), pcVar8 != (char *)0x0) {
          if (in_line[0] != '#') {
            __isoc99_sscanf(in_line,"----- %s",local_138);
            if (in_line[4] == '-' && in_line._0_4_ == 0x2d2d2d2d) goto code_r0x0010b2e9;
            pbVar7 = &xcrypt_buf;
            if (in_line[0] != '\0') {
              iVar4 = 1;
              pcVar8 = in_line;
              pbVar7 = &xcrypt_buf;
              bVar11 = in_line[0];
              do {
                pcVar8 = (char *)((byte *)pcVar8 + 1);
                bVar13 = (byte)iVar4;
                if ((bVar11 & 0x60) == 0) {
                  bVar13 = 0;
                }
                *pbVar7 = bVar13 ^ bVar11;
                iVar4 = iVar4 * 2;
                if (0x1f < iVar4) {
                  iVar4 = 1;
                }
                pbVar7 = pbVar7 + 1;
                bVar11 = *pcVar8;
              } while (bVar11 != 0);
            }
            *pbVar7 = 0;
            fputs(&xcrypt_buf,(FILE *)tfp);
            bVar2 = false;
          }
        }
        if (!bVar2) {
          uVar12 = uVar12 + 1;
          fputs("---\n",(FILE *)tfp);
          pFVar3 = ofp;
          lVar6 = ftell((FILE *)tfp);
          fprintf((FILE *)pFVar3,"%05lx\n",lVar6);
        }
        lVar6 = ftell((FILE *)ofp);
        fclose((FILE *)ifp);
        sprintf(in_line,"rewind of \"%s\"",local_238);
        iVar4 = fseek((FILE *)tfp,0,0);
        if (iVar4 == 0) {
          pcVar8 = fgets(in_line,0x100,(FILE *)tfp);
          while (pcVar8 != (char *)0x0) {
            fputs(in_line,(FILE *)ofp);
            pcVar8 = fgets(in_line,0x100,(FILE *)tfp);
          }
          fclose((FILE *)tfp);
          unlink(local_238);
          sprintf(in_line,"rewind of \"%s\"",outfile);
          iVar4 = fseek((FILE *)ofp,0,0);
          if (iVar4 == 0) {
            sprintf(in_line,"header rewrite of \"%s\"",outfile);
            iVar4 = fprintf((FILE *)ofp,"%s%5d\n",
                            "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",
                            (ulong)uVar12);
            if (-1 < iVar4) {
              sprintf(in_line,"data rewrite of \"%s\"",outfile);
              iVar4 = uVar12 + 1;
              while ((((lVar9 = ftell((FILE *)ofp), -1 < lVar9 &&
                       (iVar5 = fseek((FILE *)ofp,lVar9,0), -1 < iVar5)) &&
                      (iVar5 = __isoc99_fscanf(ofp,"%5lx",local_138), iVar5 == 1)) &&
                     ((iVar5 = fseek((FILE *)ofp,lVar9,0), -1 < iVar5 &&
                      (iVar5 = fprintf((FILE *)ofp,"%05lx\n",local_138[0] + lVar6), -1 < iVar5)))))
              {
                iVar4 = iVar4 + -1;
                if (iVar4 == 0) {
                  fclose((FILE *)ofp);
                  return;
                }
              }
            }
          }
        }
        do_oracles_cold_1();
        goto LAB_0010b5e1;
      }
      goto LAB_0010b5f1;
    }
  }
  do_oracles_cold_3();
LAB_0010b5f1:
  pcVar8 = local_238;
  do_oracles_cold_2();
  lVar6 = (long)qt_hdr.n_hdr;
  if (0 < lVar6) {
    __s2 = qt_hdr.id;
    lVar9 = 0;
    do {
      iVar4 = strncmp(pcVar8,*__s2,3);
      if (iVar4 == 0) {
        return;
      }
      lVar9 = lVar9 + 1;
      __s2 = __s2 + 1;
    } while (lVar6 != lVar9);
  }
  return;
code_r0x0010b2e9:
  bVar1 = !bVar2;
  bVar2 = true;
  if (bVar1) goto LAB_0010b364;
  goto LAB_0010b29d;
LAB_0010b364:
  uVar12 = uVar12 + 1;
  fputs("---\n",(FILE *)tfp);
  pFVar3 = ofp;
  lVar6 = ftell((FILE *)tfp);
  fprintf((FILE *)pFVar3,"%05lx\n",lVar6);
  goto LAB_0010b29a;
}

Assistant:

void do_oracles(const char *infile, const char *outfile)
{
	char	tempfile[256];
	boolean in_oracle, ok;
	long	txt_offset, offset, fpos;
	int	oracle_cnt;
	int i;

	sprintf(tempfile, "%s.%s", outfile, "tmp");

	if (!(ifp = fopen(infile, RDTMODE))) {
		perror(infile);
		exit(EXIT_FAILURE);
	}
	if (!(ofp = fopen(outfile, WRTMODE))) {
		perror(outfile);
		fclose(ifp);
		exit(EXIT_FAILURE);
	}
	if (!(tfp = fopen(tempfile, WRTMODE))) {	/* oracles.tmp */
		perror(tempfile);
		fclose(ifp);
		fclose(ofp);
		unlink(outfile);
		exit(EXIT_FAILURE);
	}

	/* output a dummy header record; we'll rewind and overwrite it later */
	fprintf(ofp, "%s%5d\n", Dont_Edit_Data, 0);

	/* handle special oracle; it must come first */
	fputs("---\n", tfp);
	fprintf(ofp, "%05lx\n", ftell(tfp));  /* start pos of special oracle */
	for (i = 0; i < SIZE(special_oracle); i++) {
	    fputs(xcrypt(special_oracle[i]), tfp);
	    fputc('\n', tfp);
	}

	oracle_cnt = 1;
	fputs("---\n", tfp);
	fprintf(ofp, "%05lx\n", ftell(tfp));	/* start pos of first oracle */
	in_oracle = FALSE;

	while (fgets(in_line, sizeof in_line, ifp)) {

	    if (h_filter(in_line)) continue;
	    if (!strncmp(in_line, "-----", 5)) {
		if (!in_oracle) continue;
		in_oracle = FALSE;
		oracle_cnt++;
		fputs("---\n", tfp);
		fprintf(ofp, "%05lx\n", ftell(tfp));
		/* start pos of this oracle */
	    } else {
		in_oracle = TRUE;
		fputs(xcrypt(in_line), tfp);
	    }
	}

	if (in_oracle) {	/* need to terminate last oracle */
	    oracle_cnt++;
	    fputs("---\n", tfp);
	    fprintf(ofp, "%05lx\n", ftell(tfp));	/* eof position */
	}

	/* record the current position */
	txt_offset = ftell(ofp);
	fclose(ifp);		/* all done with original input file */

	/* reprocess the scratch file; 1st format an error msg, just in case */
	sprintf(in_line, "rewind of \"%s\"", tempfile);
	if (rewind(tfp) != 0)  goto dead_data;
	/* copy all lines of text from the scratch file into the output file */
	while (fgets(in_line, sizeof in_line, tfp))
	    fputs(in_line, ofp);

	/* finished with scratch file */
	fclose(tfp);
	unlink(tempfile);	/* remove it */

	/* update the first record of the output file; prepare error msg 1st */
	sprintf(in_line, "rewind of \"%s\"", outfile);
	ok = (rewind(ofp) == 0);
	if (ok) {
	    sprintf(in_line, "header rewrite of \"%s\"", outfile);
	    ok = (fprintf(ofp, "%s%5d\n", Dont_Edit_Data, oracle_cnt) >=0);
	}
	if (ok) {
	    sprintf(in_line, "data rewrite of \"%s\"", outfile);
	    for (i = 0; i <= oracle_cnt; i++) {
		if (!(ok = (fpos = ftell(ofp)) >= 0)) break;
		if (!(ok = (fseek(ofp, fpos, SEEK_SET) >= 0))) break;
		if (!(ok = (fscanf(ofp, "%5lx", &offset) == 1))) break;
		if (!(ok = (fseek(ofp, fpos, SEEK_SET) >= 0))) break;
		if (!(ok = (fprintf(ofp, "%05lx\n", offset + txt_offset) >= 0)))
		    break;
	    }
	}
	if (!ok) {
dead_data:  perror(in_line);	/* report the problem */
	    /* close and kill the aborted output file, then give up */
	    fclose(ofp);
	    unlink(outfile);
	    exit(EXIT_FAILURE);
	}

	/* all done */
	fclose(ofp);

	return;
}